

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> __thiscall
cmake::CreateGlobalGenerator(cmake *this,string *gname,bool allowArch)

{
  cmExternalMakefileProjectGeneratorFactory *this_00;
  pointer pcVar1;
  pointer pbVar2;
  __type _Var3;
  pointer pcVar4;
  const_reference __y;
  undefined4 in_ECX;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__y_00;
  string *globalGenerator;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *generator;
  RegisteredGeneratorsVector *__range1;
  string fullName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generators;
  pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extra;
  _Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false> local_d8;
  undefined4 local_cc;
  string *local_c8;
  string local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  pointer local_88;
  pointer local_80;
  pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  string local_50;
  
  __y_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71(in_register_00000011,allowArch);
  local_88 = gname[1]._M_dataplus._M_p;
  pcVar4 = *(pointer *)((long)&gname->field_2 + 8);
  local_cc = in_ECX;
  local_c8 = gname;
  while (pcVar4 != local_88) {
    this_00 = *(cmExternalMakefileProjectGeneratorFactory **)pcVar4;
    local_80 = pcVar4;
    cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
              (&local_a0,this_00);
    cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_c0,this_00);
    _Var3 = std::operator==(&local_c0,__y_00);
    std::__cxx11::string::~string((string *)&local_c0);
    pbVar2 = local_a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    globalGenerator =
         local_a0.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if (_Var3) {
      (*this_00->_vptr_cmExternalMakefileProjectGeneratorFactory[2])(&local_c0);
      __y = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at(&local_a0,0);
      std::
      pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_true>
                (&local_78,
                 (unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
                  *)&local_c0,__y);
      if ((cmGlobalGenerator *)local_c0._M_dataplus._M_p != (cmGlobalGenerator *)0x0) {
        (**(code **)(*(long *)local_c0._M_dataplus._M_p + 8))();
      }
LAB_001b2a27:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a0);
      goto LAB_001b2a31;
    }
    for (; globalGenerator != pbVar2; globalGenerator = globalGenerator + 1) {
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_50,this_00);
      cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                (&local_c0,globalGenerator,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      _Var3 = std::operator==(&local_c0,__y_00);
      if (_Var3) {
        (*this_00->_vptr_cmExternalMakefileProjectGeneratorFactory[2])(&local_50,this_00);
        std::
        pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_true>
                  (&local_78,
                   (unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
                    *)&local_50,globalGenerator);
        if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
        }
        std::__cxx11::string::~string((string *)&local_c0);
        goto LAB_001b2a27;
      }
      std::__cxx11::string::~string((string *)&local_c0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a0);
    pcVar4 = local_80 + 8;
  }
  local_c0._M_dataplus._M_p = (pointer)0x0;
  std::
  pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::nullptr_t,_true>(&local_78,(void **)&local_c0,__y_00);
LAB_001b2a31:
  (this->Generators).
  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pcVar4 = (local_c8->_M_dataplus)._M_p;
  pcVar1 = (pointer)local_c8->_M_string_length;
  do {
    if (pcVar4 == pcVar1) goto LAB_001b2aac;
    (**(code **)(**(long **)pcVar4 + 0x10))
              (&local_c0,*(long **)pcVar4,&local_78.second,(undefined1)local_cc,local_c8);
    (this->Generators).
    super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_c0._M_dataplus._M_p;
    pcVar4 = pcVar4 + 8;
  } while ((cmGlobalGenerator *)local_c0._M_dataplus._M_p == (cmGlobalGenerator *)0x0);
  local_d8._M_head_impl =
       (cmExternalMakefileProjectGenerator *)
       local_78.first._M_t.
       super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
       .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl;
  local_78.first._M_t.
  super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
  .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>,_true,_true>
        )(__uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
          )0x0;
  cmGlobalGenerator::SetExternalMakefileProjectGenerator
            ((cmGlobalGenerator *)local_c0._M_dataplus._M_p,
             (unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
              *)&local_d8);
  if (local_d8._M_head_impl != (cmExternalMakefileProjectGenerator *)0x0) {
    (*(local_d8._M_head_impl)->_vptr_cmExternalMakefileProjectGenerator[1])();
  }
  local_d8._M_head_impl = (cmExternalMakefileProjectGenerator *)0x0;
LAB_001b2aac:
  std::
  pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_78);
  return (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmGlobalGenerator> cmake::CreateGlobalGenerator(
  const std::string& gname, bool allowArch)
{
  std::pair<std::unique_ptr<cmExternalMakefileProjectGenerator>, std::string>
    extra = createExtraGenerator(this->ExtraGenerators, gname);
  std::unique_ptr<cmExternalMakefileProjectGenerator>& extraGenerator =
    extra.first;
  const std::string& name = extra.second;

  std::unique_ptr<cmGlobalGenerator> generator;
  for (const auto& g : this->Generators) {
    generator = g->CreateGlobalGenerator(name, allowArch, this);
    if (generator) {
      break;
    }
  }

  if (generator) {
    generator->SetExternalMakefileProjectGenerator(std::move(extraGenerator));
  }

  return generator;
}